

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *head;
  cmMakefile *this_00;
  bool bVar1;
  reference ppcVar2;
  cmLinkInterface *this_01;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_02;
  reference pcVar3;
  string *sourceName;
  cmSourceFile *o_00;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar4;
  cmSourceFile *o;
  cmLinkItem *obj;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range2_1;
  undefined1 local_c8 [8];
  cmLinkItem libBT;
  cmLinkItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range2;
  cmLinkInterface *iface;
  cmGeneratorTarget *depender;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted_local;
  string *config_local;
  cmListFileBacktrace *dependee_backtrace_local;
  cmGeneratorTarget *dependee_local;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  head = *ppcVar2;
  this_01 = cmGeneratorTarget::GetLinkInterface(dependee,config,head);
  if (this_01 != (cmLinkInterface *)0x0) {
    __end2 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_01);
    lib = (cmLinkItem *)
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                       *)&lib), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&__end2);
      pVar4 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                        (emitted,pcVar3);
      libBT.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar4.first._M_node;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cmLinkItem::cmLinkItem((cmLinkItem *)local_c8,pcVar3);
        cmListFileBacktrace::operator=((cmListFileBacktrace *)&libBT.Cross,dependee_backtrace);
        AddTargetDepend(this,depender_index,(cmLinkItem *)local_c8,true,false);
        AddInterfaceDepends(this,depender_index,(cmLinkItem *)local_c8,config,emitted);
        cmLinkItem::~cmLinkItem((cmLinkItem *)local_c8);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end2);
    }
    this_02 = &(this_01->super_cmLinkInterfaceLibraries).Objects;
    __end2_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(this_02);
    obj = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                               *)&obj), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&__end2_1);
      this_00 = head->Makefile;
      sourceName = cmLinkItem::AsStr_abi_cxx11_(pcVar3);
      o_00 = cmMakefile::GetSource(this_00,sourceName,Known);
      if (o_00 != (cmSourceFile *)0x0) {
        AddObjectDepends(this,depender_index,o_00,emitted);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end2_1);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, const cmGeneratorTarget* dependee,
  cmListFileBacktrace const& dependee_backtrace, const std::string& config,
  std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (cmLinkItem const& lib : iface->Libraries) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(lib).second) {
        // Inject the backtrace of the original link dependency whose
        // link interface we are adding.  This indicates the line of
        // code in the project that caused this dependency to be added.
        cmLinkItem libBT = lib;
        libBT.Backtrace = dependee_backtrace;
        this->AddTargetDepend(depender_index, libBT, true, false);
        this->AddInterfaceDepends(depender_index, libBT, config, emitted);
      }
    }
    for (cmLinkItem const& obj : iface->Objects) {
      if (cmSourceFile const* o = depender->Makefile->GetSource(
            obj.AsStr(), cmSourceFileLocationKind::Known)) {
        this->AddObjectDepends(depender_index, o, emitted);
      }
    }
  }
}